

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variablebyte.h
# Opt level: O1

uint8_t * __thiscall
FastPForLib::VariableByte::decodeFromByteArray<unsigned_long>
          (VariableByte *this,uint8_t *inbyte,size_t length,unsigned_long *out,size_t *nvalue)

{
  byte *pbVar1;
  byte *pbVar2;
  byte bVar3;
  unsigned_long *puVar4;
  size_t sVar5;
  uint uVar6;
  unsigned_long uVar7;
  ulong uVar8;
  byte *pbVar9;
  
  if (length == 0) {
    sVar5 = 0;
  }
  else {
    pbVar2 = inbyte + length;
    puVar4 = out;
    if (10 < (long)length) {
      pbVar9 = inbyte + 10;
      do {
        uVar6 = *inbyte & 0x7f;
        uVar7 = (unsigned_long)uVar6;
        if ((char)*inbyte < '\0') {
          inbyte = inbyte + 1;
        }
        else {
          uVar6 = uVar6 | (inbyte[1] & 0x7f) << 7;
          uVar7 = (unsigned_long)uVar6;
          if ((char)inbyte[1] < '\0') {
            inbyte = inbyte + 2;
          }
          else {
            uVar6 = uVar6 | (inbyte[2] & 0x7f) << 0xe;
            uVar7 = (unsigned_long)uVar6;
            if ((char)inbyte[2] < '\0') {
              inbyte = inbyte + 3;
            }
            else {
              uVar7 = (unsigned_long)(uVar6 | (inbyte[3] & 0x7f) << 0x15);
              if ((char)inbyte[3] < '\0') {
                inbyte = inbyte + 4;
              }
              else {
                uVar7 = uVar7 | (ulong)(inbyte[4] & 0x7f) << 0x1c;
                if ((char)inbyte[4] < '\0') {
                  inbyte = inbyte + 5;
                }
                else {
                  uVar7 = uVar7 | (ulong)(inbyte[5] & 0x7f) << 0x23;
                  if ((char)inbyte[5] < '\0') {
                    inbyte = inbyte + 6;
                  }
                  else {
                    uVar7 = uVar7 | (ulong)(inbyte[6] & 0x7f) << 0x2a;
                    if ((char)inbyte[6] < '\0') {
                      inbyte = inbyte + 7;
                    }
                    else {
                      uVar7 = uVar7 | (ulong)(inbyte[7] & 0x7f) << 0x31;
                      if ((char)inbyte[7] < '\0') {
                        inbyte = inbyte + 8;
                      }
                      else {
                        pbVar1 = inbyte + 8;
                        uVar7 = uVar7 | (ulong)(*pbVar1 & 0x7f) << 0x38;
                        inbyte = inbyte + 9;
                        if (-1 < (char)*pbVar1) {
                          uVar7 = uVar7 | (ulong)*inbyte << 0x3f;
                          inbyte = pbVar9;
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
        *puVar4 = uVar7;
        puVar4 = puVar4 + 1;
        pbVar9 = inbyte + 10;
      } while (pbVar9 < pbVar2);
    }
    if (inbyte < pbVar2) {
      uVar7 = 0;
      uVar8 = 0;
      pbVar9 = inbyte;
      while( true ) {
        while( true ) {
          inbyte = pbVar9 + 1;
          bVar3 = *pbVar9;
          uVar7 = ((ulong)(bVar3 & 0x7f) << (uVar8 & 0x3f)) + uVar7;
          if ((char)bVar3 < '\0') {
            *puVar4 = uVar7;
            puVar4 = puVar4 + 1;
          }
          pbVar9 = inbyte;
          if (pbVar2 <= inbyte || (char)bVar3 < '\0') break;
          uVar8 = (ulong)((int)uVar8 + 7);
        }
        if (pbVar2 <= inbyte) break;
        uVar7 = 0;
        uVar8 = 0;
      }
    }
    sVar5 = (long)puVar4 - (long)out >> 3;
  }
  *nvalue = sVar5;
  return inbyte;
}

Assistant:

const uint8_t *decodeFromByteArray(const uint8_t *inbyte, const size_t length,
                                     T *out, size_t &nvalue) {
    if (length == 0) {
      nvalue = 0;
      return inbyte;  // abort
    }
    const uint8_t *const endbyte = inbyte + length;
    const T *const initout(out);
    // this assumes that there is a value to be read

    while (endbyte > inbyte + 10) {
      uint64_t c;
      T v = 0;

      c = inbyte[0];
      v = c & 0x7F;
      if (c >= 128) {
        inbyte += 1;
        *out++ = v;
        continue;
      }

      c = inbyte[1];
      v |= (c & 0x7F) << 7;
      if (c >= 128) {
        inbyte += 2;
        *out++ = v;
        continue;
      }

      c = inbyte[2];
      v |= (c & 0x7F) << 14;
      if (c >= 128) {
        inbyte += 3;
        *out++ = v;
        continue;
      }

      c = inbyte[3];
      v |= (c & 0x7F) << 21;
      if (c >= 128) {
        inbyte += 4;
        *out++ = v;
        continue;
      }

      c = inbyte[4];
      v |= (c & 0x7F) << 28;
      if (c >= 128) {
        inbyte += 5;
        *out++ = v;
        continue;
      }

      c = inbyte[5];
      v |= static_cast<uint64_t>(c & 0x7F) << 35;
      if (c >= 128) {
        inbyte += 6;
        *out++ = v;
        continue;
      }

      c = inbyte[6];
      v |= static_cast<uint64_t>(c & 0x7F) << 42;
      if (c >= 128) {
        inbyte += 7;
        *out++ = v;
        continue;
      }

      c = inbyte[7];
      v |= static_cast<uint64_t>(c & 0x7F) << 49;
      if (c >= 128) {
        inbyte += 8;
        *out++ = v;
        continue;
      }

      c = inbyte[8];
      v |= static_cast<uint64_t>(c & 0x7F) << 56;
      if (c >= 128) {
        inbyte += 9;
        *out++ = v;
        continue;
      }

      c = inbyte[9];
      inbyte += 10;
      v |= static_cast<uint64_t>(c & 0x1) << 63;
      *out++ = v;
    }

    while (endbyte > inbyte) {
      unsigned int shift = 0;
      for (T v = 0; endbyte > inbyte; shift += 7) {
        uint64_t c = *inbyte++;
        v += ((c & 127) << shift);
        if ((c & 128)) {
          *out++ = v;
          break;
        }
      }
    }
    nvalue = out - initout;
    return inbyte;
  }